

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_basic_operations.c
# Opt level: O0

void base_add(cpu_registers *registers,uint8_t operand)

{
  _Bool _Var1;
  ushort uVar2;
  uint16_t result;
  _Bool carry_bit;
  uint16_t result_carry_bit_position;
  uint8_t operand_local;
  cpu_registers *registers_local;
  
  _Var1 = get_cpu_flag(registers,'\x01');
  uVar2 = (ushort)registers->A + (ushort)operand + (ushort)_Var1;
  if (((registers->A ^ uVar2) & (operand ^ uVar2) & 0x80) == 0) {
    clear_cpu_flag(registers,'@');
  }
  else {
    set_cpu_flag(registers,'@');
  }
  if ((uVar2 & 0x100) == 0) {
    clear_cpu_flag(registers,'\x01');
  }
  else {
    set_cpu_flag(registers,'\x01');
  }
  registers->A = (uint8_t)uVar2;
  determine_zero_flag(registers,registers->A);
  determine_negative_flag(registers,registers->A);
  return;
}

Assistant:

void base_add(cpu_registers* registers, uint8_t operand) {
    const uint16_t result_carry_bit_position = 0x100;
    bool carry_bit = get_cpu_flag(registers, CARRY_FLAG);
    uint16_t result = registers->A + operand + (uint8_t)carry_bit;

    if( (registers->A ^ result) & (operand ^ result) & 0x80 ) set_cpu_flag(registers, OVERFLOW_FLAG);
    else clear_cpu_flag(registers, OVERFLOW_FLAG);
    if(result & result_carry_bit_position) set_cpu_flag(registers, CARRY_FLAG);
    else clear_cpu_flag(registers, CARRY_FLAG);

    registers->A = result & BYTE_MASK;
    determine_zero_flag(registers, registers->A);
    determine_negative_flag(registers, registers->A);
}